

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O0

void __thiscall BMRS_XZ<UF>::PerformLabeling(BMRS_XZ<UF> *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  Mat1b *pMVar4;
  uint64_t *puVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  int iVar9;
  uint local_1bc;
  uint local_1b8;
  int label_1;
  unsigned_short end_pos_1;
  int k_2;
  unsigned_short start_pos_1;
  int j_4;
  uint *labels;
  int label;
  int iStack_164;
  unsigned_short end_pos;
  int k_1;
  int k;
  unsigned_short start_pos;
  int j_3;
  uint *labels_d;
  uint *labels_u;
  uint64_t *data_d;
  uint64_t *data_u;
  Run *pRStack_130;
  int i_2;
  Run *runs;
  Size local_118;
  Mat_<int> local_110;
  ulong local_b0;
  uint64_t d_shl;
  uint64_t d;
  uint64_t u_shl;
  uint64_t u;
  ulong uStack_88;
  int j_2;
  uint64_t d0;
  uint64_t u0;
  uint64_t *bits_dest;
  uint64_t *bits_d;
  uint64_t *bits_u;
  int i_1;
  int j_1;
  uint64_t *pdata_merged_1;
  uint64_t *pdata_source;
  uint64_t *puStack_40;
  int j;
  uint64_t *pdata_merged;
  uint64_t *pdata_source2;
  uint64_t *pdata_source1;
  int local_20;
  int i;
  int data_width;
  int h_merge;
  int h;
  int w;
  BMRS_XZ<UF> *this_local;
  
  h_merge = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  data_width = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  _h = this;
  Data_Compressed::Alloc(&this->data_compressed,data_width,h_merge);
  InitCompressedData(this,&this->data_compressed);
  i = data_width / 2 + data_width % 2;
  local_20 = (this->data_compressed).data_width;
  Data_Compressed::Alloc(&this->data_merged,i,h_merge);
  for (pdata_source1._4_4_ = 0; pdata_source1._4_4_ < data_width / 2;
      pdata_source1._4_4_ = pdata_source1._4_4_ + 1) {
    pdata_source2 =
         Data_Compressed::operator[](&this->data_compressed,(long)(pdata_source1._4_4_ << 1));
    pdata_merged = Data_Compressed::operator[]
                             (&this->data_compressed,(long)(pdata_source1._4_4_ * 2 + 1));
    puStack_40 = Data_Compressed::operator[](&this->data_merged,(long)pdata_source1._4_4_);
    for (pdata_source._4_4_ = 0; pdata_source._4_4_ < local_20;
        pdata_source._4_4_ = pdata_source._4_4_ + 1) {
      puStack_40[pdata_source._4_4_] =
           pdata_source2[pdata_source._4_4_] | pdata_merged[pdata_source._4_4_];
    }
  }
  if (data_width % 2 != 0) {
    pdata_merged_1 = Data_Compressed::operator[](&this->data_compressed,(long)(data_width + -1));
    _i_1 = Data_Compressed::operator[](&this->data_merged,(long)(data_width / 2));
    for (bits_u._4_4_ = 0; bits_u._4_4_ < local_20; bits_u._4_4_ = bits_u._4_4_ + 1) {
      _i_1[bits_u._4_4_] = pdata_merged_1[bits_u._4_4_];
    }
  }
  Data_Compressed::Alloc(&this->data_flags,i + -1,h_merge);
  for (bits_u._0_4_ = 0; (int)bits_u < (this->data_flags).height; bits_u._0_4_ = (int)bits_u + 1) {
    bits_d = Data_Compressed::operator[](&this->data_compressed,(long)((int)bits_u * 2 + 1));
    bits_dest = Data_Compressed::operator[](&this->data_compressed,(long)((int)bits_u * 2 + 2));
    u0 = (uint64_t)Data_Compressed::operator[](&this->data_flags,(long)(int)bits_u);
    d0 = *bits_d;
    uStack_88 = *bits_dest;
    *(uint64_t *)u0 = (d0 | d0 << 1) & (uStack_88 | uStack_88 << 1);
    for (u._4_4_ = 1; u._4_4_ < local_20; u._4_4_ = u._4_4_ + 1) {
      u_shl = bits_d[u._4_4_];
      d = u_shl << 1;
      d_shl = bits_dest[u._4_4_];
      local_b0 = d_shl << 1;
      if ((bits_d[u._4_4_ + -1] & 0x8000000000000000) != 0) {
        d = d | 1;
      }
      if ((bits_dest[u._4_4_ + -1] & 0x8000000000000000) != 0) {
        local_b0 = local_b0 | 1;
      }
      *(uint64_t *)(u0 + (long)u._4_4_ * 8) = (u_shl | d) & (d_shl | local_b0);
    }
  }
  Runs::Alloc(&this->data_runs,i,h_merge);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar4->field_0x8;
  iVar9 = *(int *)&pMVar4->field_0xc;
  UF::Alloc(((iVar3 + 1) - (iVar3 + 1 >> 0x1f) >> 1) * ((iVar9 + 1) - (iVar9 + 1 >> 0x1f) >> 1) + 1)
  ;
  UF::Setup();
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,i,local_20,(this->data_runs).runs);
  cv::MatSize::operator()((MatSize *)&local_118);
  cv::Mat_<int>::Mat_(&local_110,&local_118);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_110);
  cv::Mat_<int>::~Mat_(&local_110);
  pRStack_130 = (this->data_runs).runs;
  for (data_u._4_4_ = 0; data_u._4_4_ < data_width / 2; data_u._4_4_ = data_u._4_4_ + 1) {
    puVar5 = (this->data_compressed).bits;
    iVar9 = (this->data_compressed).data_width * 2 * data_u._4_4_;
    iVar3 = (this->data_compressed).data_width;
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,data_u._4_4_ << 1);
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,data_u._4_4_ * 2 + 1);
    k = 0;
    for (; uVar1 = pRStack_130->start_pos, uVar1 != 0xffff; pRStack_130 = pRStack_130 + 1) {
      uVar2 = pRStack_130->end_pos;
      uVar6 = UF::GetLabel(pRStack_130->label);
      for (; k < (int)(uint)uVar1; k = k + 1) {
        puVar7[k] = 0;
        puVar8[k] = 0;
      }
      for (; k < (int)(uint)uVar2; k = k + 1) {
        local_1b8 = uVar6;
        if ((puVar5[(long)iVar9 + (long)(k >> 6)] & 1L << ((byte)k & 0x3f)) == 0) {
          local_1b8 = 0;
        }
        puVar7[k] = local_1b8;
        local_1bc = uVar6;
        if ((puVar5[(long)iVar9 + (long)iVar3 + (long)(k >> 6)] & 1L << ((byte)k & 0x3f)) == 0) {
          local_1bc = 0;
        }
        puVar8[k] = local_1bc;
      }
    }
    for (iStack_164 = k; iStack_164 < h_merge; iStack_164 = iStack_164 + 1) {
      puVar7[iStack_164] = 0;
    }
    for (label = k; label < h_merge; label = label + 1) {
      puVar8[label] = 0;
    }
    pRStack_130 = pRStack_130 + 1;
  }
  if (data_width % 2 != 0) {
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,data_width + -1);
    k_2 = 0;
    for (; uVar1 = pRStack_130->start_pos, uVar1 != 0xffff; pRStack_130 = pRStack_130 + 1) {
      uVar2 = pRStack_130->end_pos;
      uVar6 = UF::GetLabel(pRStack_130->label);
      for (; k_2 < (int)(uint)uVar1; k_2 = k_2 + 1) {
        puVar7[k_2] = 0;
      }
      for (k_2 = (int)uVar1; k_2 < (int)(uint)uVar2; k_2 = k_2 + 1) {
        puVar7[k_2] = uVar6;
      }
    }
    for (label_1 = k_2; label_1 < h_merge; label_1 = label_1 + 1) {
      puVar7[label_1] = 0;
    }
  }
  UF::Dealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(&this->data_flags);
  Data_Compressed::Dealloc(&this->data_merged);
  Data_Compressed::Dealloc(&this->data_compressed);
  return;
}

Assistant:

void PerformLabeling()
    {
		int w(img_.cols);
		int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h_merge, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        img_labels_ = cv::Mat1i(img_.size());

        // New version (uses 1-byte per pixel input)
        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }